

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall QGraphicsAnchorPrivate::unsetSpacing(QGraphicsAnchorPrivate *this)

{
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->data == (AnchorData *)0x0) {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_10 = "default";
    QMessageLogger::warning(local_28,"QGraphicsAnchor::setSpacing: The anchor does not exist.");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this->field_0x98 = this->field_0x98 & 0xfe;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      (*((this->layoutPrivate->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr)
        ->_vptr_QGraphicsLayoutItem[7])();
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorPrivate::unsetSpacing()
{
    if (!data) {
        qWarning("QGraphicsAnchor::setSpacing: The anchor does not exist.");
        return;
    }

    // Return to standard direction
    hasSize = false;

    layoutPrivate->q_func()->invalidate();
}